

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

aiScene * __thiscall Assimp::Importer::ApplyPostProcessing(Importer *this,uint pFlags)

{
  uint *puVar1;
  BaseProcess *this_00;
  __uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  _Var2;
  bool bVar3;
  int iVar4;
  Logger *pLVar5;
  ImporterPimpl *pIVar6;
  aiScene *paVar7;
  _Rb_tree_header *p_Var8;
  pointer ppBVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ValidateDSProcess ds;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  string local_58;
  __uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  local_38;
  
  if (this->pimpl == (ImporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                  ,0x2e0,"const aiScene *Assimp::Importer::ApplyPostProcessing(unsigned int)");
  }
  paVar7 = this->pimpl->mScene;
  if (paVar7 == (aiScene *)0x0) {
LAB_002ec673:
    paVar7 = (aiScene *)0x0;
  }
  else {
    if (pFlags == 0) {
      return paVar7;
    }
    bVar3 = _ValidateFlags(pFlags);
    if (!bVar3) {
      __assert_fail("_ValidateFlags(pFlags)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                    ,0x2ee,"const aiScene *Assimp::Importer::ApplyPostProcessing(unsigned int)");
    }
    pLVar5 = DefaultLogger::get();
    Logger::info(pLVar5,"Entering post processing pipeline");
    if ((pFlags >> 10 & 1) != 0) {
      ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)&local_58);
      BaseProcess::ExecuteOnScene((BaseProcess *)&local_58,this);
      paVar7 = this->pimpl->mScene;
      ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)&local_58);
      if (paVar7 == (aiScene *)0x0) goto LAB_002ec673;
    }
    uVar12 = (ulong)(pFlags | 0x400);
    if (this->pimpl->bExtraVerbose == false) {
      uVar12 = (ulong)pFlags;
    }
    iVar4 = GetPropertyInteger(this,"GLOB_MEASURE_TIME",0);
    if (iVar4 == 0) {
      local_38._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
           (tuple<Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>)
           (_Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            )0x0;
    }
    else {
      local_38._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
           (tuple<Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>)
           operator_new(0x30);
      p_Var8 = &(((Profiler *)
                 local_38._M_t.
                 super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                 .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions
                )._M_t._M_impl.super__Rb_tree_header;
      (((Profiler *)
       local_38._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions)._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (((Profiler *)
       local_38._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions)._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (((Profiler *)
       local_38._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions)._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
      (((Profiler *)
       local_38._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions)._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
      (((Profiler *)
       local_38._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions)._M_t.
      _M_impl.super__Rb_tree_header._M_node_count = 0;
    }
    pIVar6 = this->pimpl;
    ppBVar9 = (pIVar6->mPostProcessingSteps).
              super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar10 = (long)(pIVar6->mPostProcessingSteps).
                   super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar9;
    if (lVar10 != 0) {
      uVar11 = lVar10 >> 3;
      uVar13 = 0;
      do {
        this_00 = ppBVar9[uVar13];
        (*pIVar6->mProgressHandler->_vptr_ProgressHandler[4])
                  (pIVar6->mProgressHandler,uVar13,uVar11);
        iVar4 = (*this_00->_vptr_BaseProcess[2])(this_00,uVar12);
        _Var2._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
             local_38._M_t.
             super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
             .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl;
        if ((char)iVar4 != '\0') {
          if (local_38._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
              (_Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               )0x0) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"postprocess","");
            Profiling::Profiler::BeginRegion
                      ((Profiler *)
                       _Var2._M_t.
                       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
                       &local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
          BaseProcess::ExecuteOnScene(this_00,this);
          _Var2._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
               local_38._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl;
          if ((_Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               )local_38._M_t.
                super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
              (Profiler *)0x0) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"postprocess","");
            Profiling::Profiler::EndRegion
                      ((Profiler *)
                       _Var2._M_t.
                       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
                       &local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
        }
        pIVar6 = this->pimpl;
        if (pIVar6->mScene == (aiScene *)0x0) break;
        if (pIVar6->bExtraVerbose == true) {
          pLVar5 = DefaultLogger::get();
          Logger::debug(pLVar5,"Verbose Import: re-validating data structures");
          ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)&local_58);
          BaseProcess::ExecuteOnScene((BaseProcess *)&local_58,this);
          if (this->pimpl->mScene == (aiScene *)0x0) {
            pLVar5 = DefaultLogger::get();
            Logger::error(pLVar5,"Verbose Import: failed to re-validate data structures");
            ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)&local_58);
            pIVar6 = this->pimpl;
            break;
          }
          ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)&local_58);
          pIVar6 = this->pimpl;
        }
        uVar13 = (ulong)((int)uVar13 + 1);
        ppBVar9 = (pIVar6->mPostProcessingSteps).
                  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar11 = (long)(pIVar6->mPostProcessingSteps).
                       super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar9 >> 3;
      } while (uVar13 < uVar11);
    }
    (*pIVar6->mProgressHandler->_vptr_ProgressHandler[4])
              (pIVar6->mProgressHandler,
               (ulong)((long)(pIVar6->mPostProcessingSteps).
                             super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pIVar6->mPostProcessingSteps).
                            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
    pIVar6 = this->pimpl;
    if (pIVar6->mScene != (aiScene *)0x0) {
      puVar1 = (uint *)((long)pIVar6->mScene->mPrivate + 8);
      *puVar1 = *puVar1 | (uint)uVar12;
      pIVar6 = this->pimpl;
    }
    SharedPostProcessInfo::Clean(pIVar6->mPPShared);
    pLVar5 = DefaultLogger::get();
    Logger::info(pLVar5,"Leaving post processing pipeline");
    std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ::~unique_ptr((unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                   *)&local_38);
    paVar7 = this->pimpl->mScene;
  }
  return paVar7;
}

Assistant:

const aiScene* Importer::ApplyPostProcessing(unsigned int pFlags) {
    ai_assert(nullptr != pimpl);
    
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // Return immediately if no scene is active
    if (!pimpl->mScene) {
        return nullptr;
    }

    // If no flags are given, return the current scene with no further action
    if (!pFlags) {
        return pimpl->mScene;
    }

    // In debug builds: run basic flag validation
    ai_assert(_ValidateFlags(pFlags));
    ASSIMP_LOG_INFO("Entering post processing pipeline");

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
    // The ValidateDS process plays an exceptional role. It isn't contained in the global
    // list of post-processing steps, so we need to call it manually.
    if (pFlags & aiProcess_ValidateDataStructure) {
        ValidateDSProcess ds;
        ds.ExecuteOnScene (this);
        if (!pimpl->mScene) {
            return nullptr;
        }
    }
#endif // no validation
#ifdef ASSIMP_BUILD_DEBUG
    if (pimpl->bExtraVerbose)
    {
#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        ASSIMP_LOG_ERROR("Verbose Import is not available due to build settings");
#endif  // no validation
        pFlags |= aiProcess_ValidateDataStructure;
    }
#else
    if (pimpl->bExtraVerbose) {
        ASSIMP_LOG_WARN("Not a debug build, ignoring extra verbose setting");
    }
#endif // ! DEBUG

    std::unique_ptr<Profiler> profiler(GetPropertyInteger(AI_CONFIG_GLOB_MEASURE_TIME,0)?new Profiler():NULL);
    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++)   {
        BaseProcess* process = pimpl->mPostProcessingSteps[a];
        pimpl->mProgressHandler->UpdatePostProcess(static_cast<int>(a), static_cast<int>(pimpl->mPostProcessingSteps.size()) );
        if( process->IsActive( pFlags)) {
            if (profiler) {
                profiler->BeginRegion("postprocess");
            }

            process->ExecuteOnScene ( this );

            if (profiler) {
                profiler->EndRegion("postprocess");
            }
        }
        if( !pimpl->mScene) {
            break;
        }
#ifdef ASSIMP_BUILD_DEBUG

#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        continue;
#endif  // no validation

        // If the extra verbose mode is active, execute the ValidateDataStructureStep again - after each step
        if (pimpl->bExtraVerbose)   {
            ASSIMP_LOG_DEBUG("Verbose Import: re-validating data structures");

            ValidateDSProcess ds;
            ds.ExecuteOnScene (this);
            if( !pimpl->mScene) {
                ASSIMP_LOG_ERROR("Verbose Import: failed to re-validate data structures");
                break;
            }
        }
#endif // ! DEBUG
    }
    pimpl->mProgressHandler->UpdatePostProcess( static_cast<int>(pimpl->mPostProcessingSteps.size()), 
        static_cast<int>(pimpl->mPostProcessingSteps.size()) );

    // update private scene flags
    if( pimpl->mScene ) {
      ScenePriv(pimpl->mScene)->mPPStepsApplied |= pFlags;
    }

    // clear any data allocated by post-process steps
    pimpl->mPPShared->Clean();
    ASSIMP_LOG_INFO("Leaving post processing pipeline");

    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    
    return pimpl->mScene;
}